

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O1

civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> __thiscall
absl::lts_20240722::time_internal::cctz::detail::operator-
          (detail *this,civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> a,
          diff_t n)

{
  unkuint10 Var1;
  hour_t hh;
  long cd;
  month_t m;
  int_least8_t ss;
  char cVar2;
  minute_t mm;
  fields fVar3;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> cVar4;
  
  m = (month_t)a.f_.y;
  ss = a.f_.y._4_1_;
  mm = a.f_.y._3_1_;
  cVar2 = a.f_.y._1_1_;
  hh = a.f_.y._2_1_;
  if (a.f_._8_8_ == -0x8000000000000000) {
    fVar3 = impl::n_day((year_t)this,m,(long)cVar2,0x7fffffffffffffff,hh,mm,ss);
    this = (detail *)fVar3.y;
    hh = fVar3.hh;
    cVar2 = fVar3.d;
    ss = fVar3.ss;
    mm = fVar3.mm;
    m = fVar3.m;
    cd = 1;
  }
  else {
    cd = -a.f_._8_8_;
  }
  fVar3 = impl::n_day((year_t)this,m,(long)cVar2,cd,hh,mm,ss);
  Var1 = fVar3._0_10_;
  cVar4.f_.hh = '\0';
  cVar4.f_.mm = '\0';
  cVar4.f_.ss = '\0';
  cVar4.f_._13_3_ = 0;
  cVar4.f_.y = (long)Var1;
  cVar4.f_.m = (char)(Var1 >> 0x40);
  cVar4.f_.d = (char)(Var1 >> 0x48);
  return (civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag>)cVar4.f_;
}

Assistant:

CONSTEXPR_F civil_time operator-(civil_time a, diff_t n) noexcept {
    return n != (std::numeric_limits<diff_t>::min)()
               ? civil_time(step(T{}, a.f_, -n))
               : civil_time(step(T{}, step(T{}, a.f_, -(n + 1)), 1));
  }